

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaSAXUnplug(xmlSchemaSAXPlugPtr plug)

{
  void **user_data;
  xmlSAXHandlerPtr *sax;
  xmlSchemaSAXPlugPtr plug_local;
  
  if ((plug == (xmlSchemaSAXPlugPtr)0x0) || (plug->magic != 0xdc43ba21)) {
    plug_local._4_4_ = -1;
  }
  else {
    plug->magic = 0;
    xmlSchemaPostRun(plug->ctxt);
    *plug->user_sax_ptr = plug->user_sax;
    if (plug->user_sax != (xmlSAXHandlerPtr)0x0) {
      *plug->user_data_ptr = plug->user_data;
    }
    (*xmlFree)(plug);
    plug_local._4_4_ = 0;
  }
  return plug_local._4_4_;
}

Assistant:

int
xmlSchemaSAXUnplug(xmlSchemaSAXPlugPtr plug)
{
    xmlSAXHandlerPtr *sax;
    void **user_data;

    if ((plug == NULL) || (plug->magic != XML_SAX_PLUG_MAGIC))
        return(-1);
    plug->magic = 0;

    xmlSchemaPostRun(plug->ctxt);
    /* restore the data */
    sax = plug->user_sax_ptr;
    *sax = plug->user_sax;
    if (plug->user_sax != NULL) {
	user_data = plug->user_data_ptr;
	*user_data = plug->user_data;
    }

    /* free and return */
    xmlFree(plug);
    return(0);
}